

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aAccuracyTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Accuracy::AccuracyTests::init(AccuracyTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  AccuracyTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  VaryingInterpolationTests::VaryingInterpolationTests
            ((VaryingInterpolationTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureTests::TextureTests((TextureTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void AccuracyTests::init (void)
{
	addChild(new VaryingInterpolationTests	(m_context));
	addChild(new TextureTests				(m_context));
}